

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O3

BinaryOperatorTypes *
soul::TypeRules::getTypesForEqualityOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  Category CVar1;
  Category CVar2;
  Structure *pSVar3;
  bool bVar4;
  bool bVar5;
  PrimitiveType PVar6;
  BoundedIntSize BVar7;
  StructurePtr o;
  uint uVar8;
  uint uVar9;
  ArraySize size;
  PrimitiveType local_6c [3];
  BinaryOperatorTypes local_60;
  
  if ((a->category == stringLiteral) && (b->category == stringLiteral)) {
    (__return_storage_ptr__->resultType).category = primitive;
    (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
    (__return_storage_ptr__->resultType).isRef = false;
    (__return_storage_ptr__->resultType).isConstant = false;
    (__return_storage_ptr__->resultType).primitiveType = bool_;
    (__return_storage_ptr__->resultType).boundingSize = 0;
    (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
    CVar1 = a->arrayElementCategory;
    bVar4 = a->isRef;
    bVar5 = a->isConstant;
    PVar6.type = (a->primitiveType).type;
    (__return_storage_ptr__->operandType).category = a->category;
    (__return_storage_ptr__->operandType).arrayElementCategory = CVar1;
    (__return_storage_ptr__->operandType).isRef = bVar4;
    (__return_storage_ptr__->operandType).isConstant = bVar5;
    (__return_storage_ptr__->operandType).primitiveType = (PrimitiveType)PVar6.type;
    BVar7 = a->arrayElementBoundingSize;
    (__return_storage_ptr__->operandType).boundingSize = a->boundingSize;
    (__return_storage_ptr__->operandType).arrayElementBoundingSize = BVar7;
    pSVar3 = (a->structure).object;
    (__return_storage_ptr__->operandType).structure.object = pSVar3;
    if (pSVar3 == (Structure *)0x0) {
      return __return_storage_ptr__;
    }
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
    return __return_storage_ptr__;
  }
  if ((1 < (a->primitiveType).type - complex32) && (1 < (b->primitiveType).type - complex32)) {
    getTypesForComparisonOp(__return_storage_ptr__,a,b);
    return __return_storage_ptr__;
  }
  getTypesForArithmeticOp(&local_60,a,b,true);
  o.object = local_60.operandType.structure.object;
  local_6c[1].type = local_60.operandType.boundingSize;
  local_6c[2].type = local_60.operandType.arrayElementBoundingSize;
  local_60.operandType.structure.object = (Structure *)0x0;
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_60.resultType.structure.object);
  if (local_60.operandType.category != invalid) {
    CVar1 = a->category;
    uVar8 = (uint)CVar1;
    if (CVar1 != primitive) {
      if (CVar1 != vector) goto LAB_001d96e4;
      uVar8 = a->boundingSize;
    }
    CVar2 = b->category;
    uVar9 = (uint)CVar2;
    if (CVar2 != primitive) {
      if (CVar2 != vector) {
LAB_001d96e4:
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      uVar9 = b->boundingSize;
    }
    if (uVar8 == uVar9) {
      if (CVar1 == vector) {
        size = (ArraySize)a->boundingSize;
LAB_001d9688:
        local_6c[0].type = bool_;
        Type::createVector(&__return_storage_ptr__->resultType,local_6c,size);
      }
      else {
        if (CVar2 == vector) {
          size = 1;
          goto LAB_001d9688;
        }
        (__return_storage_ptr__->resultType).category = primitive;
        (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
        (__return_storage_ptr__->resultType).isRef = false;
        (__return_storage_ptr__->resultType).isConstant = false;
        (__return_storage_ptr__->resultType).primitiveType = bool_;
        (__return_storage_ptr__->resultType).boundingSize = 0;
        (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
      }
      (__return_storage_ptr__->operandType).category = local_60.operandType.category;
      (__return_storage_ptr__->operandType).arrayElementCategory =
           local_60.operandType.arrayElementCategory;
      (__return_storage_ptr__->operandType).isRef = local_60.operandType.isRef;
      (__return_storage_ptr__->operandType).isConstant = local_60.operandType.isConstant;
      (__return_storage_ptr__->operandType).primitiveType.type =
           local_60.operandType.primitiveType.type;
      (__return_storage_ptr__->operandType).boundingSize = local_6c[1].type;
      (__return_storage_ptr__->operandType).arrayElementBoundingSize = local_6c[2].type;
      (__return_storage_ptr__->operandType).structure.object = o.object;
      if (o.object != (Structure *)0x0) {
        ((o.object)->super_RefCountedObject).refCount =
             ((o.object)->super_RefCountedObject).refCount + 1;
      }
      goto LAB_001d96ca;
    }
  }
  (__return_storage_ptr__->operandType).boundingSize = 0;
  (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->operandType).category = invalid;
  (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
  (__return_storage_ptr__->operandType).isRef = false;
  (__return_storage_ptr__->operandType).isConstant = false;
  (__return_storage_ptr__->operandType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).category = invalid;
  (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
  (__return_storage_ptr__->resultType).isRef = false;
  (__return_storage_ptr__->resultType).isConstant = false;
  (__return_storage_ptr__->resultType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).boundingSize = 0;
  (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
LAB_001d96ca:
  RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForEqualityOp (const Type& a, const Type& b)
    {
        // Special case for string literals - they support ==, != but are unordered, so you can't do other comparisons
        if (a.isStringLiteral() && b.isStringLiteral())
            return { PrimitiveType::bool_, a };

        if (a.isComplex() || b.isComplex())
        {
            auto operandType = getTypesForArithmeticOp (a, b, true).operandType;

            if (operandType.isValid()
                && a.getVectorSize() == b.getVectorSize())
            {
                if (a.isVector() || b.isVector())
                    return { Type::createVector (PrimitiveType::bool_, a.getVectorSize()), operandType };

                return { PrimitiveType::bool_, operandType };
            }

            return {};
        }

        return getTypesForComparisonOp (a, b);
    }